

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimSnapshotManager.cpp
# Opt level: O1

void __thiscall
OpenMD::SimSnapshotManager::SimSnapshotManager
          (SimSnapshotManager *this,SimInfo *info,int atomStorageLayout,int rigidBodyStorageLayout,
          int cutoffGroupStorageLayout)

{
  bool usePBC;
  int nAtoms;
  int nRigidbodies;
  int nCutoffGroups;
  Snapshot *pSVar1;
  
  (this->super_SnapshotManager).atomStorageLayout_ = atomStorageLayout;
  (this->super_SnapshotManager).rigidBodyStorageLayout_ = rigidBodyStorageLayout;
  (this->super_SnapshotManager).cutoffGroupStorageLayout_ = cutoffGroupStorageLayout;
  (this->super_SnapshotManager).currentSnapshot_ = (Snapshot *)0x0;
  (this->super_SnapshotManager).previousSnapshot_ = (Snapshot *)0x0;
  (this->super_SnapshotManager)._vptr_SnapshotManager =
       (_func_int **)&PTR__SimSnapshotManager_002f99e8;
  this->info_ = info;
  nAtoms = info->nAtoms_;
  nRigidbodies = info->nRigidBodies_;
  nCutoffGroups = info->nCutoffGroups_;
  usePBC = (bool)(info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  pSVar1 = (Snapshot *)operator_new(0xa98);
  Snapshot::Snapshot(pSVar1,nAtoms,nRigidbodies,nCutoffGroups,atomStorageLayout,
                     rigidBodyStorageLayout,cutoffGroupStorageLayout,usePBC);
  (this->super_SnapshotManager).previousSnapshot_ = pSVar1;
  pSVar1 = (Snapshot *)operator_new(0xa98);
  Snapshot::Snapshot(pSVar1,nAtoms,nRigidbodies,nCutoffGroups,atomStorageLayout,
                     rigidBodyStorageLayout,cutoffGroupStorageLayout,usePBC);
  (this->super_SnapshotManager).currentSnapshot_ = pSVar1;
  return;
}

Assistant:

SimSnapshotManager::SimSnapshotManager(SimInfo* info, int atomStorageLayout,
                                         int rigidBodyStorageLayout,
                                         int cutoffGroupStorageLayout) :
      SnapshotManager(atomStorageLayout, rigidBodyStorageLayout,
                      cutoffGroupStorageLayout),
      info_(info) {
    int nAtoms        = info_->getNAtoms();
    int nRigidBodies  = info_->getNRigidBodies();
    int nCutoffGroups = info_->getNCutoffGroups();
    bool usePBC = info_->getSimParams()->getUsePeriodicBoundaryConditions();

    // allocate memory for snapshots
    previousSnapshot_ =
        new Snapshot(nAtoms, nRigidBodies, nCutoffGroups, atomStorageLayout,
                     rigidBodyStorageLayout, cutoffGroupStorageLayout, usePBC);
    currentSnapshot_ =
        new Snapshot(nAtoms, nRigidBodies, nCutoffGroups, atomStorageLayout,
                     rigidBodyStorageLayout, cutoffGroupStorageLayout, usePBC);
  }